

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O1

void __thiscall
Liby::BlockingQueue<std::function<void_()>_>::push_back
          (BlockingQueue<std::function<void_()>_> *this,const_reference_type e)

{
  size_t *psVar1;
  int iVar2;
  _Node *p_Var3;
  undefined8 uVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    p_Var3 = std::__cxx11::list<std::function<void()>,std::allocator<std::function<void()>>>::
             _M_create_node<std::function<void()>const&>
                       ((list<std::function<void()>,std::allocator<std::function<void()>>> *)
                        &this->queue_,e);
    std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
    psVar1 = &(this->queue_).
              super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  uVar4 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar4);
}

Assistant:

void push_back(const_reference_type e) {
        std::lock_guard<std::mutex> G_(mutex_);
        queue_.emplace_back(e);
    }